

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::applyBC
          (MLEBABecLap *this,int amrlev,int mglev,MultiFab *in,BCMode bc_mode,StateMode s_mode,
          MLMGBndry *bndry,bool skip_fillboundary)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  FabSet *pFVar4;
  int r;
  uint uVar5;
  int iVar6;
  int iVar7;
  EBFArrayBoxFactory *this_00;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  bool bVar24;
  uint uVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  Periodicity PVar31;
  IntVect IVar32;
  Array4<double> local_5b0;
  BCMode local_56c;
  ulong local_568;
  int local_560;
  int local_55c;
  double *local_558;
  long local_550;
  long local_548;
  double *local_540;
  long local_538;
  int local_52c;
  double *local_528;
  undefined8 uStack_520;
  ulong local_510;
  int local_504;
  double *local_500;
  long local_4f8;
  ulong local_4f0;
  int local_4e4;
  ulong local_4e0;
  long local_4d8;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  Array4<const_int> local_4c0;
  ulong local_480;
  long local_478;
  long local_470;
  long local_468;
  long local_460;
  long local_458;
  long local_450;
  long local_448;
  long local_440;
  long local_438;
  double *local_430;
  ulong local_428;
  int local_420;
  int local_41c;
  long local_418;
  long local_410;
  IntVect hi;
  undefined4 uStack_3fc;
  long local_3f8;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  Array4<const_double> local_3c8;
  IntVect low;
  FabType local_31c;
  double local_318 [4];
  Array4<const_int> local_2f8;
  ulong local_2b8;
  long local_2b0;
  Array4<const_double> local_2a8;
  Array4<const_double> local_268;
  long local_228;
  long local_220;
  double *local_218;
  int local_20c;
  double local_208;
  double local_200;
  double local_1f8;
  ulong local_1f0;
  double *local_1e8;
  FabArray<amrex::FArrayBox> *local_1e0;
  FabArray<amrex::EBCellFlagFab> *local_1d8;
  long local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long local_1b8;
  ulong local_1b0;
  Box local_1a4;
  double local_188;
  undefined8 uStack_180;
  long local_178;
  ulong local_170;
  long local_168;
  double *local_160;
  long local_158;
  long local_150;
  undefined1 local_148 [16];
  FabSet *local_138;
  long local_130;
  FabArray<amrex::IArrayBox> *local_128;
  long *local_120;
  long *local_118;
  ulong local_110;
  Array<const_MultiCutFab_*,_3> local_108;
  MFIter mfi;
  MFItInfo local_8c;
  FArrayBox foofab;
  
  local_56c = bc_mode;
  local_1e0 = &in->super_FabArray<amrex::FArrayBox>;
  uVar5 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  lVar13 = (long)mglev;
  if (!skip_fillboundary) {
    PVar31 = Geometry::periodicity
                       ((Geometry *)
                        (lVar13 * 200 +
                        *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom
                                  .
                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                        ));
    low.vect[0] = PVar31.period.vect[0];
    low.vect[1] = PVar31.period.vect[1];
    low.vect[2] = PVar31.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>(local_1e0,0,uVar5,(Periodicity *)&low,false);
  }
  this->m_is_eb_inhomog = (uint)(s_mode == Solution);
  local_1b0 = (ulong)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.maxorder;
  if (4 < (long)local_1b0) {
    Assert_host("imaxorder <= 4",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
                ,0x3f9,"\"MLEBABecLap::applyBC: maxorder too high\"");
  }
  lVar14 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar15 = lVar13 * 200;
  local_1f8 = *(double *)(lVar14 + 0x38 + lVar15);
  local_200 = *(double *)(lVar14 + 0x40 + lVar15);
  local_208 = *(double *)(lVar14 + 0x48 + lVar15);
  local_130 = lVar13 * 0x900 +
              *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_maskvals.
                        super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  local_128 = (FabArray<amrex::IArrayBox> *)
              (lVar13 * 0x180 +
              *(long *)&(this->m_cc_mask).
                        super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                        super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>);
  local_178 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_bcondloc.
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                       + lVar13 * 8);
  lVar13 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory
                               .
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + lVar13 * 8);
  if ((lVar13 == 0) ||
     (this_00 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar13,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0),
     this_00 == (EBFArrayBoxFactory *)0x0)) {
    local_108._M_elems[0] = (MultiCutFab *)0x0;
    local_108._M_elems[1] = (MultiCutFab *)0x0;
    local_108._M_elems[2] = (MultiCutFab *)0x0;
    local_1d8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_1d8 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    EBFArrayBoxFactory::getAreaFrac(&local_108,this_00);
  }
  low.vect[0] = 0;
  low.vect[1] = 0;
  low.vect[2] = 0;
  FArrayBox::FArrayBox(&foofab,(Box *)&low,uVar5,true,false,(Arena *)0x0);
  local_148._8_8_ = foofab.super_BaseFab<double>.dptr;
  local_1c4 = foofab.super_BaseFab<double>.nvar;
  local_1b8 = (long)foofab.super_BaseFab<double>.domain.smallend.vect[2];
  local_8c.do_tiling = false;
  local_8c.dynamic = true;
  local_8c.device_sync = true;
  local_8c.num_streams = Gpu::Device::max_gpu_streams;
  local_8c.tilesize.vect[0] = 0;
  local_8c.tilesize.vect[1] = 0;
  local_8c.tilesize.vect[2] = 0;
  MFIter::MFIter(&mfi,&local_1e0->super_FabArrayBase,&local_8c);
  local_158 = (long)foofab.super_BaseFab<double>.domain.bigend.vect[2] + 1;
  local_160 = (double *)
              (((long)foofab.super_BaseFab<double>.domain.bigend.vect[0] -
               (long)foofab.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
  local_150 = (((long)foofab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
              (long)foofab.super_BaseFab<double>.domain.smallend.vect[1]) * (long)local_160;
  local_168 = (local_158 - local_1b8) * local_150;
  local_148._4_4_ = foofab.super_BaseFab<double>.domain.smallend.vect[1];
  local_148._0_4_ = foofab.super_BaseFab<double>.domain.smallend.vect[0];
  local_170 = (long)foofab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
              (long)foofab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
  local_138 = (bndry->super_InterpBndryData).super_BndryData.super_BndryRegister.bndry;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  local_110 = (ulong)uVar5;
  local_228 = local_1b0 - 2;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      BaseFab<double>::~BaseFab(&foofab.super_BaseFab<double>);
      return;
    }
    MFIter::validbox(&local_1a4,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_5b0,local_1e0,&mfi);
    if (local_1d8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      local_31c = regular;
LAB_0066843c:
      piVar17 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar17 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      local_120 = (long *)(*(long *)(local_178 + 0x200) + (long)*piVar17 * 0x18);
      local_118 = (long *)((long)*piVar17 * 0x18 + *(long *)(local_178 + 0xf0));
      lVar13 = 0;
      while (lVar13 != 3) {
        low.vect[2] = local_1a4.smallend.vect[2];
        low.vect[0] = local_1a4.smallend.vect[0];
        low.vect[1] = local_1a4.smallend.vect[1];
        hi.vect[2] = local_1a4.bigend.vect[2];
        hi.vect[0] = local_1a4.bigend.vect[0];
        hi.vect[1] = local_1a4.bigend.vect[1];
        iVar6 = low.vect[lVar13] + -1;
        low.vect[lVar13] = iVar6;
        hi.vect[lVar13] = iVar6;
        local_428 = (ulong)(uint)low.vect[0];
        local_4f0 = (ulong)(uint)low.vect[1];
        local_510 = (ulong)(uint)low.vect[2];
        iVar6 = hi.vect[0];
        local_52c = hi.vect[1];
        local_55c = hi.vect[2];
        low.vect[2] = local_1a4.smallend.vect[2];
        low.vect[0] = local_1a4.smallend.vect[0];
        low.vect[1] = local_1a4.smallend.vect[1];
        hi.vect[2] = local_1a4.bigend.vect[2];
        hi.vect[0] = local_1a4.bigend.vect[0];
        hi.vect[1] = local_1a4.bigend.vect[1];
        local_220 = lVar13;
        IVar32 = Box::type(&local_1a4);
        lVar13 = local_220;
        local_2f8.p = IVar32.vect._0_8_;
        local_2f8.jstride._0_4_ = IVar32.vect[2];
        iVar7 = (~*(uint *)((long)&local_2f8.p + local_220 * 4) & 1) + hi.vect[local_220];
        low.vect[local_220] = iVar7;
        hi.vect[lVar13] = iVar7;
        lVar14 = local_130;
        local_4e4 = low.vect[0];
        local_504 = hi.vect[1];
        local_560 = hi.vect[2];
        iVar7 = hi.vect[0];
        uVar5 = low.vect[2];
        uVar25 = low.vect[1];
        if (local_31c != regular) {
          if ((int)lVar13 == 1) {
            local_428 = (ulong)((int)local_428 - 1);
            local_510 = (ulong)((int)local_510 - 1);
            iVar6 = iVar6 + 1;
            iVar23 = 1;
            uVar9 = 1;
          }
          else if ((int)lVar13 == 0) {
            local_4f0 = (ulong)((int)local_4f0 - 1);
            local_510 = (ulong)((int)local_510 - 1);
            local_52c = local_52c + 1;
            iVar23 = 1;
            uVar9 = 0x100000000;
          }
          else {
            local_428 = (ulong)((int)local_428 - 1);
            local_4f0 = (ulong)((int)local_4f0 - 1);
            iVar6 = iVar6 + 1;
            local_52c = local_52c + 1;
            uVar9 = 0x100000001;
            iVar23 = 0;
          }
          local_55c = local_55c + iVar23;
          local_4e4 = low.vect[0] - (int)uVar9;
          iVar12 = (int)((ulong)uVar9 >> 0x20);
          local_504 = hi.vect[1] + iVar12;
          local_560 = hi.vect[2] + iVar23;
          iVar7 = hi.vect[0] + (int)uVar9;
          uVar5 = low.vect[2] - iVar23;
          uVar25 = low.vect[1] - iVar12;
        }
        local_480 = (ulong)uVar25;
        local_4e0 = (ulong)uVar5;
        local_568 = CONCAT44(local_568._4_4_,iVar6);
        iVar6 = local_1a4.bigend.vect[lVar13];
        iVar23 = local_1a4.smallend.vect[lVar13];
        FabArray<amrex::Mask>::array<amrex::Mask,_0>
                  ((Array4<const_int> *)&hi,(FabArray<amrex::Mask> *)(local_130 + lVar13 * 0x180),
                   &mfi);
        FabArray<amrex::Mask>::array<amrex::Mask,_0>
                  (&local_2f8,(FabArray<amrex::Mask> *)(lVar14 + (lVar13 + 3) * 0x180),&mfi);
        pFVar4 = local_138;
        if (bndry == (MLMGBndry *)0x0) {
          local_268.p = (double *)local_148._8_8_;
          local_268.jstride = (Long)local_160;
          local_268.kstride = local_150;
          local_268.nstride = local_168;
          local_268.begin.x = local_148._0_4_;
          local_268.begin.y = local_148._4_4_;
          local_268.begin.z = (int)local_1b8;
          local_268.end.x = (undefined4)local_170;
          local_268.end.y = local_170._4_4_;
          local_268.end.z = (int)local_158;
          local_268.ncomp = local_1c4;
          local_2a8.p = (double *)local_148._8_8_;
          local_2a8.jstride = (Long)local_160;
          local_2a8.kstride = local_150;
          local_2a8.nstride = local_168;
          local_2a8.begin.x = local_148._0_4_;
          local_2a8.begin.y = local_148._4_4_;
          local_2a8.begin.z = (int)local_1b8;
          local_2a8.end.x = (undefined4)local_170;
          local_2a8.end.y = local_170._4_4_;
          local_2a8.end.z = (int)local_158;
          local_2a8.ncomp = local_1c4;
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_268,(FabArray<amrex::FArrayBox> *)(local_138 + lVar13),&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_2a8,(FabArray<amrex::FArrayBox> *)(pFVar4 + lVar13 + 3),&mfi);
        }
        uVar5 = (iVar6 - iVar23) + 2;
        local_1f0 = (ulong)uVar5;
        if ((int)local_1b0 < (int)uVar5) {
          local_1f0 = local_1b0 & 0xffffffff;
        }
        local_4c4 = (int)local_4f0 + 1;
        iVar6 = (int)local_1f0;
        local_41c = (int)local_480 + -1;
        local_20c = (int)local_428 + 1;
        local_4c8 = (int)local_510 + 1;
        local_420 = (int)local_4e0 + -1;
        lVar13 = (long)(iVar6 + -2);
        local_470 = (long)(int)local_4f0;
        local_468 = (long)(int)local_428;
        local_4f8 = (long)(int)local_568;
        local_4d8 = (long)local_4e4;
        local_548 = (long)iVar7;
        local_438 = (long)local_52c;
        local_478 = (long)(int)local_480;
        local_440 = (long)local_504;
        local_2b8 = 0;
        if (0 < iVar6) {
          local_2b8 = local_1f0;
        }
        lVar14 = (long)iVar6;
        local_448 = local_468 * 4;
        local_410 = (long)(int)local_510;
        local_450 = local_468 * 8;
        local_458 = local_4d8 * 4;
        local_418 = (long)(int)local_4e0;
        local_460 = local_4d8 * 8;
        local_1bc = local_4e4 + -1;
        local_1d0 = (long)(local_4e4 + -1);
        local_550 = 0;
        uVar22 = 0;
        local_2b0 = (long)local_20c;
        while( true ) {
          uVar3 = local_1f0;
          uVar18 = local_2b8;
          dVar29 = 1.0;
          dVar28 = 1.0;
          if (uVar22 == local_110) break;
          lVar15 = uVar22 * 0x18 + *local_118;
          lVar10 = uVar22 * 0x30 + *local_120;
          iVar6 = *(int *)(lVar15 + local_220 * 4);
          local_4cc = *(int *)(lVar15 + 0xc + local_220 * 4);
          pdVar1 = *(double **)(lVar10 + local_220 * 8);
          dVar30 = *(double *)(lVar10 + 0x18 + local_220 * 8);
          local_568 = uVar22;
          if (local_31c == regular) {
            if ((int)local_220 == 1) {
              if (iVar6 == 0x65) {
                dVar27 = -(double)pdVar1 * local_200;
                low.vect[0] = SUB84(dVar27,0);
                low.vect[1] = (int)((ulong)dVar27 >> 0x20);
                low.vect[2] = 0;
                local_3c8.kstride = 0;
                local_3c8.nstride = 0;
                local_3c8.p = (double *)0x0;
                local_3c8.jstride = 0;
                low.vect._0_8_ = dVar27;
                for (uVar8 = 0; uVar11 = local_510, uVar8 != uVar18; uVar8 = uVar8 + 1) {
                  dVar27 = dVar28;
                  dVar2 = dVar29;
                  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                    if (uVar8 != uVar11) {
                      dVar27 = dVar27 * (-0.5 - *(double *)(low.vect + uVar11 * 2));
                      dVar2 = dVar2 * (*(double *)(low.vect + uVar8 * 2) -
                                      *(double *)(low.vect + uVar11 * 2));
                    }
                  }
                  (&local_3c8.p)[uVar8] = (double *)(dVar27 / dVar2);
                }
                while (iVar6 = (int)uVar11, iVar6 <= local_55c) {
                  lVar19 = (long)(int)local_4f0;
                  local_528 = (double *)CONCAT44(local_528._4_4_,iVar6);
                  lVar10 = (long)iVar6;
                  lVar16 = (lVar19 - local_5b0.begin.y) * local_5b0.jstride;
                  lVar21 = (lVar10 - local_5b0.begin.z) * local_5b0.kstride;
                  for (lVar15 = local_468; lVar15 <= local_4f8; lVar15 = lVar15 + 1) {
                    if (0 < *(int *)((lVar19 - local_3e4) * CONCAT44(uStack_3fc,hi.vect[2]) * 4 +
                                     hi.vect._0_8_ + (lVar10 - local_3e0) * local_3f8 * 4 +
                                    (lVar15 - local_3e8) * 4)) {
                      dVar27 = 0.0;
                      for (lVar20 = 1; lVar20 < lVar14; lVar20 = lVar20 + 1) {
                        dVar27 = dVar27 + local_5b0.p
                                          [(lVar15 - local_5b0.begin.x) +
                                           (lVar10 - local_5b0.begin.z) * local_5b0.kstride +
                                           local_5b0.nstride * uVar22 +
                                           (((int)local_4f0 - local_5b0.begin.y) + (int)lVar20) *
                                           local_5b0.jstride] * (double)(&local_3c8.p)[lVar20];
                      }
                      local_5b0.p
                      [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)]
                           = dVar27;
                      if (local_56c == Inhomogeneous) {
                        local_5b0.p
                        [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)
                        ] = local_268.p
                            [(lVar19 - local_268.begin.y) * local_268.jstride +
                             (lVar10 - local_268.begin.z) * local_268.kstride +
                             local_268.nstride * uVar22 + (lVar15 - local_268.begin.x)] *
                            (double)local_3c8.p + dVar27;
                      }
                    }
                  }
                  uVar11 = (ulong)(iVar6 + 1);
                }
              }
              else {
                lVar15 = local_410;
                if (iVar6 == 0x66) {
                  for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                    lVar10 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar16 = 0; local_468 + lVar16 <= local_4f8; lVar16 = lVar16 + 1) {
                      if (0 < *(int *)((long)((int)local_4f0 - local_3e4) *
                                       CONCAT44(uStack_3fc,hi.vect[2]) * 4 +
                                       (lVar15 - local_3e0) * local_3f8 * 4 + (long)local_3e8 * -4 +
                                       hi.vect._0_8_ + local_448 + lVar16 * 4)) {
                        *(undefined8 *)
                         ((long)local_5b0.p +
                         lVar16 * 8 +
                         local_5b0.jstride * 8 * (long)((int)local_4f0 - local_5b0.begin.y) +
                         lVar10 * 8 + local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 +
                         local_450) = *(undefined8 *)
                                       ((long)local_5b0.p +
                                       lVar16 * 8 +
                                       (long)(local_4c4 - local_5b0.begin.y) * local_5b0.jstride * 8
                                       + lVar10 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_450);
                      }
                    }
                  }
                }
                else if (iVar6 == 0x67) {
                  for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                    lVar10 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar16 = 0; local_468 + lVar16 <= local_4f8; lVar16 = lVar16 + 1) {
                      if (0 < *(int *)((long)((int)local_4f0 - local_3e4) *
                                       CONCAT44(uStack_3fc,hi.vect[2]) * 4 +
                                       (lVar15 - local_3e0) * local_3f8 * 4 + (long)local_3e8 * -4 +
                                       hi.vect._0_8_ + local_448 + lVar16 * 4)) {
                        *(ulong *)((long)local_5b0.p +
                                  lVar16 * 8 +
                                  local_5b0.jstride * 8 * (long)((int)local_4f0 - local_5b0.begin.y)
                                  + lVar10 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_450) =
                             *(ulong *)((long)local_5b0.p +
                                       lVar16 * 8 +
                                       (long)(local_4c4 - local_5b0.begin.y) * local_5b0.jstride * 8
                                       + lVar10 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_450) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
              uVar3 = local_1f0;
              uVar18 = local_2b8;
              iVar6 = (int)local_480;
              if (local_4cc == 0x65) {
                dVar30 = -dVar30 * local_200;
                low.vect[0] = SUB84(dVar30,0);
                low.vect[1] = (int)((ulong)dVar30 >> 0x20);
                low.vect[2] = 0;
                local_3c8.kstride = 0;
                local_3c8.nstride = 0;
                local_3c8.p = (double *)0x0;
                local_3c8.jstride = 0;
                low.vect._0_8_ = dVar30;
                for (uVar8 = 0; uVar11 = local_4e0, uVar8 != uVar18; uVar8 = uVar8 + 1) {
                  dVar30 = dVar28;
                  dVar27 = dVar29;
                  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                    if (uVar8 != uVar11) {
                      dVar30 = dVar30 * (-0.5 - *(double *)(low.vect + uVar11 * 2));
                      dVar27 = dVar27 * (*(double *)(low.vect + uVar8 * 2) -
                                        *(double *)(low.vect + uVar11 * 2));
                    }
                  }
                  (&local_3c8.p)[uVar8] = (double *)(dVar30 / dVar27);
                }
                while (iVar7 = (int)uVar11, iVar7 <= local_560) {
                  lVar19 = (long)iVar6;
                  local_528 = (double *)CONCAT44(local_528._4_4_,iVar7);
                  lVar10 = (long)iVar7;
                  lVar16 = (lVar19 - local_5b0.begin.y) * local_5b0.jstride;
                  lVar21 = (lVar10 - local_5b0.begin.z) * local_5b0.kstride;
                  for (lVar15 = local_4d8; lVar15 <= local_548; lVar15 = lVar15 + 1) {
                    if (0 < local_2f8.p
                            [(lVar19 - local_2f8.begin.y) *
                             CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) +
                             (lVar10 - local_2f8.begin.z) * local_2f8.kstride +
                             (lVar15 - local_2f8.begin.x)]) {
                      iVar23 = local_41c - local_5b0.begin.y;
                      dVar28 = 0.0;
                      for (lVar20 = 1; lVar20 < lVar14; lVar20 = lVar20 + 1) {
                        dVar28 = dVar28 + local_5b0.p
                                          [(lVar15 - local_5b0.begin.x) +
                                           (lVar10 - local_5b0.begin.z) * local_5b0.kstride +
                                           local_5b0.nstride * uVar22 + local_5b0.jstride * iVar23]
                                          * (double)(&local_3c8.p)[lVar20];
                        iVar23 = iVar23 + -1;
                      }
                      local_5b0.p
                      [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)]
                           = dVar28;
                      if (local_56c == Inhomogeneous) {
                        local_5b0.p
                        [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)
                        ] = local_2a8.p
                            [(lVar19 - local_2a8.begin.y) * local_2a8.jstride +
                             (lVar10 - local_2a8.begin.z) * local_2a8.kstride +
                             local_2a8.nstride * uVar22 + (lVar15 - local_2a8.begin.x)] *
                            (double)local_3c8.p + dVar28;
                      }
                    }
                  }
                  uVar11 = (ulong)(iVar7 + 1);
                }
              }
              else {
                lVar15 = local_418;
                if (local_4cc == 0x66) {
                  for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                    lVar16 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar10 = 0; local_4d8 + lVar10 <= local_548; lVar10 = lVar10 + 1) {
                      if (0 < *(int *)((long)local_2f8.p +
                                      lVar10 * 4 +
                                      (long)(iVar6 - local_2f8.begin.y) *
                                      CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 4 +
                                      (lVar15 - local_2f8.begin.z) * local_2f8.kstride * 4 +
                                      (long)local_2f8.begin.x * -4 + local_458)) {
                        *(undefined8 *)
                         ((long)local_5b0.p +
                         lVar10 * 8 +
                         local_5b0.jstride * 8 * (long)(iVar6 - local_5b0.begin.y) + lVar16 * 8 +
                         local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 + local_460) =
                             *(undefined8 *)
                              ((long)local_5b0.p +
                              lVar10 * 8 +
                              (long)(~local_5b0.begin.y + iVar6) * local_5b0.jstride * 8 +
                              lVar16 * 8 + local_5b0.nstride * local_550 +
                              (long)local_5b0.begin.x * -8 + local_460);
                      }
                    }
                  }
                }
                else if (local_4cc == 0x67) {
                  for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                    lVar16 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar10 = 0; local_4d8 + lVar10 <= local_548; lVar10 = lVar10 + 1) {
                      if (0 < *(int *)((long)local_2f8.p +
                                      lVar10 * 4 +
                                      (long)(iVar6 - local_2f8.begin.y) *
                                      CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 4 +
                                      (lVar15 - local_2f8.begin.z) * local_2f8.kstride * 4 +
                                      (long)local_2f8.begin.x * -4 + local_458)) {
                        *(ulong *)((long)local_5b0.p +
                                  lVar10 * 8 +
                                  local_5b0.jstride * 8 * (long)(iVar6 - local_5b0.begin.y) +
                                  lVar16 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_460) =
                             *(ulong *)((long)local_5b0.p +
                                       lVar10 * 8 +
                                       (long)(~local_5b0.begin.y + iVar6) * local_5b0.jstride * 8 +
                                       lVar16 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_460) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
            else if ((int)local_220 == 0) {
              if (iVar6 == 0x65) {
                dVar27 = -(double)pdVar1 * local_1f8;
                low.vect[0] = SUB84(dVar27,0);
                low.vect[1] = (int)((ulong)dVar27 >> 0x20);
                low.vect[2] = 0;
                local_3c8.kstride = 0;
                local_3c8.nstride = 0;
                local_3c8.p = (double *)0x0;
                local_3c8.jstride = 0;
                low.vect._0_8_ = dVar27;
                for (uVar8 = 0; uVar8 != uVar18; uVar8 = uVar8 + 1) {
                  dVar27 = dVar28;
                  dVar2 = dVar29;
                  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                    if (uVar8 != uVar11) {
                      dVar27 = dVar27 * (-0.5 - *(double *)(low.vect + uVar11 * 2));
                      dVar2 = dVar2 * (*(double *)(low.vect + uVar8 * 2) -
                                      *(double *)(low.vect + uVar11 * 2));
                    }
                  }
                  (&local_3c8.p)[uVar8] = (double *)(dVar27 / dVar2);
                }
                uVar18 = local_510 & 0xffffffff;
                while (iVar6 = (int)uVar18, iVar6 <= local_55c) {
                  lVar10 = (long)(int)local_428;
                  local_538 = CONCAT44(local_538._4_4_,iVar6);
                  lVar16 = (long)iVar6;
                  lVar19 = (lVar16 - local_5b0.begin.z) * local_5b0.kstride;
                  local_528 = (double *)(long)local_268.begin.y;
                  local_558 = (double *)local_268.jstride;
                  for (lVar15 = local_470; lVar15 <= local_438; lVar15 = lVar15 + 1) {
                    if (0 < *(int *)((lVar10 - local_3e8) * 4 + hi.vect._0_8_ +
                                     (lVar16 - local_3e0) * local_3f8 * 4 +
                                    (lVar15 - local_3e4) * CONCAT44(uStack_3fc,hi.vect[2]) * 4)) {
                      dVar27 = 0.0;
                      for (lVar21 = 1; lVar21 < lVar14; lVar21 = lVar21 + 1) {
                        dVar27 = dVar27 + local_5b0.p
                                          [(lVar15 - local_5b0.begin.y) * local_5b0.jstride +
                                           (lVar16 - local_5b0.begin.z) * local_5b0.kstride +
                                           local_5b0.nstride * uVar22 +
                                           (long)(((int)local_428 - local_5b0.begin.x) + (int)lVar21
                                                 )] * (double)(&local_3c8.p)[lVar21];
                      }
                      lVar21 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                      local_5b0.p
                      [(lVar10 - local_5b0.begin.x) + lVar19 + local_5b0.nstride * uVar22 + lVar21]
                           = dVar27;
                      if (local_56c == Inhomogeneous) {
                        local_5b0.p
                        [(lVar10 - local_5b0.begin.x) + lVar19 + local_5b0.nstride * uVar22 + lVar21
                        ] = local_268.p
                            [(lVar10 - local_268.begin.x) +
                             (lVar16 - local_268.begin.z) * local_268.kstride +
                             local_268.nstride * uVar22 +
                             (lVar15 - (long)local_528) * local_268.jstride] * (double)local_3c8.p +
                            dVar27;
                      }
                    }
                  }
                  uVar18 = (ulong)(iVar6 + 1);
                }
              }
              else {
                lVar15 = local_410;
                if (iVar6 == 0x66) {
                  for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                    piVar17 = (int *)((local_470 - local_3e4) * CONCAT44(uStack_3fc,hi.vect[2]) * 4
                                      + (lVar15 - local_3e0) * local_3f8 * 4 + (long)local_3e8 * -4
                                     + hi.vect._0_8_ + local_448);
                    lVar16 = local_5b0.nstride * local_550 +
                             (local_470 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                             (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                             (long)local_5b0.p;
                    for (lVar10 = local_470; lVar10 <= local_438; lVar10 = lVar10 + 1) {
                      if (0 < *piVar17) {
                        *(undefined8 *)(lVar16 + local_450 + (long)local_5b0.begin.x * -8) =
                             *(undefined8 *)(lVar16 + (long)(local_20c - local_5b0.begin.x) * 8);
                      }
                      piVar17 = piVar17 + CONCAT44(uStack_3fc,hi.vect[2]);
                      lVar16 = lVar16 + local_5b0.jstride * 8;
                    }
                  }
                }
                else if (iVar6 == 0x67) {
                  for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                    piVar17 = (int *)((local_470 - local_3e4) * CONCAT44(uStack_3fc,hi.vect[2]) * 4
                                      + (lVar15 - local_3e0) * local_3f8 * 4 + (long)local_3e8 * -4
                                     + hi.vect._0_8_ + local_448);
                    lVar16 = local_5b0.nstride * local_550 +
                             (local_470 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                             (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                             (long)local_5b0.p;
                    for (lVar10 = local_470; lVar10 <= local_438; lVar10 = lVar10 + 1) {
                      if (0 < *piVar17) {
                        *(ulong *)(lVar16 + local_450 + (long)local_5b0.begin.x * -8) =
                             *(ulong *)(lVar16 + (long)((int)local_2b0 - local_5b0.begin.x) * 8) ^
                             0x8000000000000000;
                      }
                      piVar17 = piVar17 + CONCAT44(uStack_3fc,hi.vect[2]);
                      lVar16 = lVar16 + local_5b0.jstride * 8;
                    }
                  }
                }
              }
              uVar3 = local_1f0;
              uVar18 = local_2b8;
              if (local_4cc == 0x65) {
                dVar30 = -dVar30 * local_1f8;
                low.vect[0] = SUB84(dVar30,0);
                low.vect[1] = (int)((ulong)dVar30 >> 0x20);
                low.vect[2] = 0;
                local_3c8.kstride = 0;
                local_3c8.nstride = 0;
                local_3c8.p = (double *)0x0;
                local_3c8.jstride = 0;
                low.vect._0_8_ = dVar30;
                for (uVar8 = 0; uVar8 != uVar18; uVar8 = uVar8 + 1) {
                  dVar30 = dVar28;
                  dVar27 = dVar29;
                  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                    if (uVar8 != uVar11) {
                      dVar30 = dVar30 * (-0.5 - *(double *)(low.vect + uVar11 * 2));
                      dVar27 = dVar27 * (*(double *)(low.vect + uVar8 * 2) -
                                        *(double *)(low.vect + uVar11 * 2));
                    }
                  }
                  (&local_3c8.p)[uVar8] = (double *)(dVar30 / dVar27);
                }
                uVar18 = local_4e0 & 0xffffffff;
                while (iVar6 = (int)uVar18, iVar6 <= local_560) {
                  lVar10 = (long)local_4e4;
                  local_558 = (double *)CONCAT44(local_558._4_4_,iVar6);
                  lVar16 = (long)iVar6;
                  lVar19 = (lVar16 - local_5b0.begin.z) * local_5b0.kstride;
                  local_528 = (double *)(long)local_2a8.begin.y;
                  for (lVar15 = local_478; lVar15 <= local_440; lVar15 = lVar15 + 1) {
                    if (0 < local_2f8.p
                            [(lVar10 - local_2f8.begin.x) +
                             (lVar16 - local_2f8.begin.z) * local_2f8.kstride +
                             (lVar15 - local_2f8.begin.y) *
                             CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride)]) {
                      iVar7 = local_1bc - local_5b0.begin.x;
                      dVar28 = 0.0;
                      for (lVar21 = 1; lVar21 < lVar14; lVar21 = lVar21 + 1) {
                        dVar28 = dVar28 + local_5b0.p
                                          [(lVar15 - local_5b0.begin.y) * local_5b0.jstride +
                                           (lVar16 - local_5b0.begin.z) * local_5b0.kstride +
                                           local_5b0.nstride * uVar22 + (long)iVar7] *
                                          (double)(&local_3c8.p)[lVar21];
                        iVar7 = iVar7 + -1;
                      }
                      lVar21 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                      local_5b0.p
                      [(lVar10 - local_5b0.begin.x) + lVar19 + local_5b0.nstride * uVar22 + lVar21]
                           = dVar28;
                      if (local_56c == Inhomogeneous) {
                        local_5b0.p
                        [(lVar10 - local_5b0.begin.x) + lVar19 + local_5b0.nstride * uVar22 + lVar21
                        ] = local_2a8.p
                            [(lVar10 - local_2a8.begin.x) +
                             (lVar16 - local_2a8.begin.z) * local_2a8.kstride +
                             local_2a8.nstride * uVar22 +
                             (lVar15 - (long)local_528) * local_2a8.jstride] * (double)local_3c8.p +
                            dVar28;
                      }
                    }
                  }
                  uVar18 = (ulong)(iVar6 + 1);
                }
              }
              else {
                lVar15 = local_418;
                if (local_4cc == 0x66) {
                  for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                    piVar17 = (int *)((long)local_2f8.p +
                                     (local_478 - local_2f8.begin.y) *
                                     CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 4 +
                                     (lVar15 - local_2f8.begin.z) * local_2f8.kstride * 4 +
                                     (long)local_2f8.begin.x * -4 + local_458);
                    lVar16 = local_5b0.nstride * local_550 +
                             (local_478 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                             (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                             (long)local_5b0.p;
                    for (lVar10 = local_478; lVar10 <= local_440; lVar10 = lVar10 + 1) {
                      if (0 < *piVar17) {
                        *(undefined8 *)(lVar16 + local_460 + (long)local_5b0.begin.x * -8) =
                             *(undefined8 *)(lVar16 + (long)(~local_5b0.begin.x + local_4e4) * 8);
                      }
                      piVar17 = piVar17 + CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride);
                      lVar16 = lVar16 + local_5b0.jstride * 8;
                    }
                  }
                }
                else if (local_4cc == 0x67) {
                  for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                    piVar17 = (int *)((long)local_2f8.p +
                                     (local_478 - local_2f8.begin.y) *
                                     CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 4 +
                                     (lVar15 - local_2f8.begin.z) * local_2f8.kstride * 4 +
                                     (long)local_2f8.begin.x * -4 + local_458);
                    lVar16 = local_5b0.nstride * local_550 +
                             (local_478 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                             (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                             (long)local_5b0.p;
                    for (lVar10 = local_478; lVar10 <= local_440; lVar10 = lVar10 + 1) {
                      if (0 < *piVar17) {
                        *(ulong *)(lVar16 + local_460 + (long)local_5b0.begin.x * -8) =
                             *(ulong *)(lVar16 + (long)(~local_5b0.begin.x + local_4e4) * 8) ^
                             0x8000000000000000;
                      }
                      piVar17 = piVar17 + CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride);
                      lVar16 = lVar16 + local_5b0.jstride * 8;
                    }
                  }
                }
              }
            }
            else {
              if (iVar6 == 0x65) {
                dVar27 = -(double)pdVar1 * local_208;
                low.vect[0] = SUB84(dVar27,0);
                low.vect[1] = (int)((ulong)dVar27 >> 0x20);
                low.vect[2] = 0;
                local_3c8.kstride = 0;
                local_3c8.nstride = 0;
                local_3c8.p = (double *)0x0;
                local_3c8.jstride = 0;
                low.vect._0_8_ = dVar27;
                for (uVar8 = 0; uVar11 = local_4f0, uVar8 != uVar18; uVar8 = uVar8 + 1) {
                  dVar27 = dVar28;
                  dVar2 = dVar29;
                  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                    if (uVar8 != uVar11) {
                      dVar27 = dVar27 * (-0.5 - *(double *)(low.vect + uVar11 * 2));
                      dVar2 = dVar2 * (*(double *)(low.vect + uVar8 * 2) -
                                      *(double *)(low.vect + uVar11 * 2));
                    }
                  }
                  (&local_3c8.p)[uVar8] = (double *)(dVar27 / dVar2);
                }
                while (iVar6 = (int)uVar11, iVar6 <= local_52c) {
                  local_528 = (double *)CONCAT44(local_528._4_4_,iVar6);
                  lVar10 = (long)iVar6;
                  lVar19 = (long)(int)local_510;
                  lVar16 = (lVar10 - local_5b0.begin.y) * local_5b0.jstride;
                  lVar21 = (lVar19 - local_5b0.begin.z) * local_5b0.kstride;
                  for (lVar15 = local_468; lVar15 <= local_4f8; lVar15 = lVar15 + 1) {
                    if (0 < *(int *)((lVar10 - local_3e4) * CONCAT44(uStack_3fc,hi.vect[2]) * 4 +
                                     hi.vect._0_8_ + (lVar19 - local_3e0) * local_3f8 * 4 +
                                    (lVar15 - local_3e8) * 4)) {
                      dVar27 = 0.0;
                      for (lVar20 = 1; lVar20 < lVar14; lVar20 = lVar20 + 1) {
                        dVar27 = dVar27 + local_5b0.p
                                          [(lVar10 - local_5b0.begin.y) * local_5b0.jstride +
                                           (lVar15 - local_5b0.begin.x) +
                                           local_5b0.nstride * uVar22 +
                                           (((int)local_510 - local_5b0.begin.z) + (int)lVar20) *
                                           local_5b0.kstride] * (double)(&local_3c8.p)[lVar20];
                      }
                      local_5b0.p
                      [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)]
                           = dVar27;
                      if (local_56c == Inhomogeneous) {
                        local_5b0.p
                        [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)
                        ] = local_268.p
                            [(lVar10 - local_268.begin.y) * local_268.jstride +
                             (lVar19 - local_268.begin.z) * local_268.kstride +
                             local_268.nstride * uVar22 + (lVar15 - local_268.begin.x)] *
                            (double)local_3c8.p + dVar27;
                      }
                    }
                  }
                  uVar11 = (ulong)(iVar6 + 1);
                }
              }
              else {
                lVar15 = local_470;
                if (iVar6 == 0x66) {
                  for (; (int)lVar15 <= local_52c; lVar15 = lVar15 + 1) {
                    lVar10 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                    for (lVar16 = 0; local_468 + lVar16 <= local_4f8; lVar16 = lVar16 + 1) {
                      if (0 < *(int *)(((int)local_510 - local_3e0) * local_3f8 * 4 +
                                       (lVar15 - local_3e4) * CONCAT44(uStack_3fc,hi.vect[2]) * 4 +
                                       (long)local_3e8 * -4 + hi.vect._0_8_ + local_448 + lVar16 * 4
                                      )) {
                        *(undefined8 *)
                         ((long)local_5b0.p +
                         lVar16 * 8 +
                         (long)((int)local_510 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                         lVar10 * 8 + local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 +
                         local_450) = *(undefined8 *)
                                       ((long)local_5b0.p +
                                       lVar16 * 8 +
                                       local_5b0.kstride * 8 * (long)(local_4c8 - local_5b0.begin.z)
                                       + lVar10 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_450);
                      }
                    }
                  }
                }
                else if (iVar6 == 0x67) {
                  for (; (int)lVar15 <= local_52c; lVar15 = lVar15 + 1) {
                    lVar10 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                    for (lVar16 = 0; local_468 + lVar16 <= local_4f8; lVar16 = lVar16 + 1) {
                      if (0 < *(int *)(((int)local_510 - local_3e0) * local_3f8 * 4 +
                                       (lVar15 - local_3e4) * CONCAT44(uStack_3fc,hi.vect[2]) * 4 +
                                       (long)local_3e8 * -4 + hi.vect._0_8_ + local_448 + lVar16 * 4
                                      )) {
                        *(ulong *)((long)local_5b0.p +
                                  lVar16 * 8 +
                                  (long)((int)local_510 - local_5b0.begin.z) * local_5b0.kstride * 8
                                  + lVar10 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_450) =
                             *(ulong *)((long)local_5b0.p +
                                       lVar16 * 8 +
                                       local_5b0.kstride * 8 * (long)(local_4c8 - local_5b0.begin.z)
                                       + lVar10 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_450) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
              uVar3 = local_1f0;
              uVar18 = local_2b8;
              iVar6 = (int)local_4e0;
              if (local_4cc == 0x65) {
                dVar30 = -dVar30 * local_208;
                low.vect[0] = SUB84(dVar30,0);
                low.vect[1] = (int)((ulong)dVar30 >> 0x20);
                low.vect[2] = 0;
                local_3c8.kstride = 0;
                local_3c8.nstride = 0;
                local_3c8.p = (double *)0x0;
                local_3c8.jstride = 0;
                low.vect._0_8_ = dVar30;
                for (uVar8 = 0; uVar11 = local_480, uVar8 != uVar18; uVar8 = uVar8 + 1) {
                  dVar30 = dVar28;
                  dVar27 = dVar29;
                  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                    if (uVar8 != uVar11) {
                      dVar30 = dVar30 * (-0.5 - *(double *)(low.vect + uVar11 * 2));
                      dVar27 = dVar27 * (*(double *)(low.vect + uVar8 * 2) -
                                        *(double *)(low.vect + uVar11 * 2));
                    }
                  }
                  (&local_3c8.p)[uVar8] = (double *)(dVar30 / dVar27);
                }
                while (iVar7 = (int)uVar11, iVar7 <= local_504) {
                  local_528 = (double *)CONCAT44(local_528._4_4_,iVar7);
                  lVar10 = (long)iVar7;
                  lVar19 = (long)iVar6;
                  lVar16 = (lVar10 - local_5b0.begin.y) * local_5b0.jstride;
                  lVar21 = (lVar19 - local_5b0.begin.z) * local_5b0.kstride;
                  for (lVar15 = local_4d8; lVar15 <= local_548; lVar15 = lVar15 + 1) {
                    if (0 < local_2f8.p
                            [(lVar10 - local_2f8.begin.y) *
                             CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) +
                             (lVar19 - local_2f8.begin.z) * local_2f8.kstride +
                             (lVar15 - local_2f8.begin.x)]) {
                      iVar23 = local_420 - local_5b0.begin.z;
                      dVar28 = 0.0;
                      for (lVar20 = 1; lVar20 < lVar14; lVar20 = lVar20 + 1) {
                        dVar28 = dVar28 + local_5b0.p
                                          [(lVar10 - local_5b0.begin.y) * local_5b0.jstride +
                                           (lVar15 - local_5b0.begin.x) +
                                           local_5b0.nstride * uVar22 + local_5b0.kstride * iVar23]
                                          * (double)(&local_3c8.p)[lVar20];
                        iVar23 = iVar23 + -1;
                      }
                      local_5b0.p
                      [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)]
                           = dVar28;
                      if (local_56c == Inhomogeneous) {
                        local_5b0.p
                        [lVar16 + lVar21 + local_5b0.nstride * uVar22 + (lVar15 - local_5b0.begin.x)
                        ] = local_2a8.p
                            [(lVar10 - local_2a8.begin.y) * local_2a8.jstride +
                             (lVar19 - local_2a8.begin.z) * local_2a8.kstride +
                             local_2a8.nstride * uVar22 + (lVar15 - local_2a8.begin.x)] *
                            (double)local_3c8.p + dVar28;
                      }
                    }
                  }
                  uVar11 = (ulong)(iVar7 + 1);
                }
              }
              else {
                lVar15 = local_478;
                if (local_4cc == 0x66) {
                  for (; (int)lVar15 <= local_504; lVar15 = lVar15 + 1) {
                    lVar16 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                    for (lVar10 = 0; local_4d8 + lVar10 <= local_548; lVar10 = lVar10 + 1) {
                      if (0 < *(int *)((long)local_2f8.p +
                                      lVar10 * 4 +
                                      (iVar6 - local_2f8.begin.z) * local_2f8.kstride * 4 +
                                      (lVar15 - local_2f8.begin.y) *
                                      CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 4 +
                                      (long)local_2f8.begin.x * -4 + local_458)) {
                        *(undefined8 *)
                         ((long)local_5b0.p +
                         lVar10 * 8 +
                         (long)(iVar6 - local_5b0.begin.z) * local_5b0.kstride * 8 + lVar16 * 8 +
                         local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 + local_460) =
                             *(undefined8 *)
                              ((long)local_5b0.p +
                              lVar10 * 8 +
                              local_5b0.kstride * 8 * (long)(~local_5b0.begin.z + iVar6) +
                              lVar16 * 8 + local_5b0.nstride * local_550 +
                              (long)local_5b0.begin.x * -8 + local_460);
                      }
                    }
                  }
                }
                else if (local_4cc == 0x67) {
                  for (; (int)lVar15 <= local_504; lVar15 = lVar15 + 1) {
                    lVar16 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                    for (lVar10 = 0; local_4d8 + lVar10 <= local_548; lVar10 = lVar10 + 1) {
                      if (0 < *(int *)((long)local_2f8.p +
                                      lVar10 * 4 +
                                      (iVar6 - local_2f8.begin.z) * local_2f8.kstride * 4 +
                                      (lVar15 - local_2f8.begin.y) *
                                      CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 4 +
                                      (long)local_2f8.begin.x * -4 + local_458)) {
                        *(ulong *)((long)local_5b0.p +
                                  lVar10 * 8 +
                                  (long)(iVar6 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                                  lVar16 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_460) =
                             *(ulong *)((long)local_5b0.p +
                                       lVar10 * 8 +
                                       local_5b0.kstride * 8 * (long)(~local_5b0.begin.z + iVar6) +
                                       lVar16 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_460) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            uStack_520 = 0;
            local_188 = dVar30;
            uStack_180 = 0;
            local_528 = pdVar1;
            MultiCutFab::const_array(&local_3c8,local_108._M_elems[local_220],&mfi);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_4c0,local_128,&mfi);
            lVar10 = local_228;
            lVar15 = local_2b0;
            if ((int)local_220 == 1) {
              iVar7 = (int)local_4f0;
              if (iVar6 == 0x65) {
                local_318[0] = -(double)local_528 * local_200;
                local_318[1] = 0.5;
                local_318[2] = 1.5;
                local_318[3] = 2.5;
                low.vect[0] = 0;
                low.vect[1] = 0;
                low.vect[2] = 0;
                lVar15 = 2;
                for (lVar16 = 0; lVar16 <= lVar10; lVar16 = lVar16 + 1) {
                  for (lVar19 = 0; lVar19 != lVar15; lVar19 = lVar19 + 1) {
                    dVar28 = 1.0;
                    dVar29 = 1.0;
                    for (lVar21 = 0; lVar15 != lVar21; lVar21 = lVar21 + 1) {
                      if (lVar19 != lVar21) {
                        dVar28 = dVar28 * (-0.5 - local_318[lVar21]);
                        dVar29 = dVar29 * (local_318[lVar19] - local_318[lVar21]);
                      }
                    }
                    *(double *)((long)&low + lVar19 * 8 + lVar16 * 0x20) = dVar28 / dVar29;
                  }
                  lVar15 = lVar15 + 1;
                }
                uVar22 = local_510 & 0xffffffff;
                while (iVar6 = (int)uVar22, iVar6 <= local_55c) {
                  local_500 = (double *)CONCAT44(local_500._4_4_,iVar6);
                  local_528 = (double *)(long)iVar6;
                  lVar19 = ((long)local_528 - (long)local_4c0.begin.z) * local_4c0.kstride;
                  local_558 = (double *)
                              (local_4c0.p +
                              (local_4c4 - local_4c0.begin.y) * local_4c0.jstride + lVar19);
                  lVar20 = (long)local_5b0.begin.x;
                  lVar16 = ((long)iVar7 - (long)local_5b0.begin.y) * local_5b0.jstride;
                  lVar21 = ((long)local_528 - (long)local_5b0.begin.z) * local_5b0.kstride;
                  lVar10 = local_5b0.nstride * local_568;
                  local_538 = (long)local_268.begin.x;
                  local_540 = local_268.p +
                              ((long)iVar7 - (long)local_268.begin.y) * local_268.jstride +
                              ((long)local_528 - (long)local_268.begin.z) * local_268.kstride +
                              local_268.nstride * local_568;
                  for (lVar15 = local_468; lVar15 <= local_4f8; lVar15 = lVar15 + 1) {
                    if ((local_4c0.p
                         [(iVar7 - local_4c0.begin.y) * local_4c0.jstride +
                          lVar19 + (lVar15 - local_4c0.begin.x)] == 0) &&
                       (*(int *)((long)local_558 + (lVar15 - local_4c0.begin.x) * 4) == 1)) {
                      lVar26 = 0;
                      bVar24 = false;
                      while ((lVar26 <= lVar13 &&
                             (0.0 < local_3c8.p
                                    [(lVar15 - local_3c8.begin.x) +
                                     ((long)local_528 - (long)local_3c8.begin.z) * local_3c8.kstride
                                     + ((local_4c4 - local_3c8.begin.y) + (int)lVar26) *
                                       local_3c8.jstride]))) {
                        bVar24 = (bool)(bVar24 | local_3c8.p
                                                 [(lVar15 - local_3c8.begin.x) +
                                                  ((long)local_528 - (long)local_3c8.begin.z) *
                                                  local_3c8.kstride +
                                                  ((local_4c4 - local_3c8.begin.y) + (int)lVar26) *
                                                  local_3c8.jstride] < 1.0);
                        lVar26 = lVar26 + 1;
                      }
                      uVar25 = (int)lVar26 + 1;
                      uVar5 = 2;
                      if (uVar25 < 2) {
                        uVar5 = uVar25;
                      }
                      if (!bVar24) {
                        uVar5 = uVar25;
                      }
                      if (uVar5 == 1) {
                        if (local_56c == Inhomogeneous) {
                          local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] =
                               local_540[lVar15 - local_538];
                        }
                        else {
                          local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] = 0.0;
                        }
                      }
                      else {
                        lVar26 = (long)(int)(uVar5 * 4 + -8);
                        dVar28 = 0.0;
                        for (uVar22 = 1; uVar22 < uVar5; uVar22 = uVar22 + 1) {
                          dVar28 = dVar28 + local_5b0.p
                                            [(lVar15 - local_5b0.begin.x) +
                                             ((long)local_528 - (long)local_5b0.begin.z) *
                                             local_5b0.kstride +
                                             local_5b0.nstride * local_568 +
                                             ((iVar7 - local_5b0.begin.y) + (int)uVar22) *
                                             local_5b0.jstride] *
                                            *(double *)(low.vect + lVar26 * 2 + uVar22 * 2);
                        }
                        local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] = dVar28;
                        if (local_56c == Inhomogeneous) {
                          local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] =
                               local_540[lVar15 - local_538] * *(double *)(low.vect + lVar26 * 2) +
                               dVar28;
                        }
                      }
                    }
                  }
                  uVar22 = (ulong)(iVar6 + 1);
                }
              }
              else {
                lVar15 = local_410;
                if (iVar6 == 0x66) {
                  for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                    lVar19 = (lVar15 - local_4c0.begin.z) * local_4c0.kstride;
                    lVar10 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar16 = 0; local_468 + lVar16 <= local_4f8; lVar16 = lVar16 + 1) {
                      if ((*(int *)((long)local_4c0.p +
                                   lVar16 * 4 +
                                   (long)(iVar7 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                                   lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 0) &&
                         (*(int *)((long)local_4c0.p +
                                  lVar16 * 4 +
                                  local_4c0.jstride * 4 * (long)(local_4c4 - local_4c0.begin.y) +
                                  lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 1)) {
                        *(undefined8 *)
                         ((long)local_5b0.p +
                         lVar16 * 8 +
                         local_5b0.jstride * 8 * (long)(iVar7 - local_5b0.begin.y) + lVar10 * 8 +
                         local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 + local_450) =
                             *(undefined8 *)
                              ((long)local_5b0.p +
                              lVar16 * 8 +
                              (long)(local_4c4 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                              lVar10 * 8 + local_5b0.nstride * local_550 +
                              (long)local_5b0.begin.x * -8 + local_450);
                      }
                    }
                  }
                }
                else if (iVar6 == 0x67) {
                  for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                    lVar19 = (lVar15 - local_4c0.begin.z) * local_4c0.kstride;
                    lVar10 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar16 = 0; local_468 + lVar16 <= local_4f8; lVar16 = lVar16 + 1) {
                      if ((*(int *)((long)local_4c0.p +
                                   lVar16 * 4 +
                                   (long)(iVar7 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                                   lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 0) &&
                         (*(int *)((long)local_4c0.p +
                                  lVar16 * 4 +
                                  local_4c0.jstride * 4 * (long)(local_4c4 - local_4c0.begin.y) +
                                  lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 1)) {
                        *(ulong *)((long)local_5b0.p +
                                  lVar16 * 8 +
                                  local_5b0.jstride * 8 * (long)(iVar7 - local_5b0.begin.y) +
                                  lVar10 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_450) =
                             *(ulong *)((long)local_5b0.p +
                                       lVar16 * 8 +
                                       (long)(local_4c4 - local_5b0.begin.y) * local_5b0.jstride * 8
                                       + lVar10 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_450) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
              lVar15 = local_228;
              iVar6 = (int)local_480;
              if (local_4cc == 0x65) {
                local_318[0] = -local_188 * local_200;
                local_318[1] = 0.5;
                local_318[2] = 1.5;
                local_318[3] = 2.5;
                low.vect[0] = 0;
                low.vect[1] = 0;
                low.vect[2] = 0;
                lVar10 = 2;
                for (lVar16 = 0; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
                  for (lVar19 = 0; lVar19 != lVar10; lVar19 = lVar19 + 1) {
                    dVar28 = 1.0;
                    dVar29 = 1.0;
                    for (lVar21 = 0; lVar10 != lVar21; lVar21 = lVar21 + 1) {
                      if (lVar19 != lVar21) {
                        dVar28 = dVar28 * (-0.5 - local_318[lVar21]);
                        dVar29 = dVar29 * (local_318[lVar19] - local_318[lVar21]);
                      }
                    }
                    *(double *)((long)&low + lVar19 * 8 + lVar16 * 0x20) = dVar28 / dVar29;
                  }
                  lVar10 = lVar10 + 1;
                }
                uVar22 = local_4e0 & 0xffffffff;
                while (iVar7 = (int)uVar22, iVar7 <= local_560) {
                  local_500 = (double *)CONCAT44(local_500._4_4_,iVar7);
                  local_528 = (double *)(long)iVar7;
                  lVar19 = ((long)local_528 - (long)local_4c0.begin.z) * local_4c0.kstride;
                  local_558 = (double *)
                              (local_4c0.p +
                              (~local_4c0.begin.y + iVar6) * local_4c0.jstride + lVar19);
                  lVar20 = (long)local_5b0.begin.x;
                  lVar16 = ((long)iVar6 - (long)local_5b0.begin.y) * local_5b0.jstride;
                  lVar21 = ((long)local_528 - (long)local_5b0.begin.z) * local_5b0.kstride;
                  lVar10 = local_5b0.nstride * local_568;
                  local_538 = (long)local_2a8.begin.x;
                  local_540 = local_2a8.p +
                              ((long)iVar6 - (long)local_2a8.begin.y) * local_2a8.jstride +
                              ((long)local_528 - (long)local_2a8.begin.z) * local_2a8.kstride +
                              local_2a8.nstride * local_568;
                  for (lVar15 = local_4d8; lVar15 <= local_548; lVar15 = lVar15 + 1) {
                    if ((local_4c0.p
                         [(iVar6 - local_4c0.begin.y) * local_4c0.jstride +
                          lVar19 + (lVar15 - local_4c0.begin.x)] == 0) &&
                       (*(int *)((long)local_558 + (lVar15 - local_4c0.begin.x) * 4) == 1)) {
                      iVar23 = iVar6 - local_3c8.begin.y;
                      lVar26 = 0;
                      bVar24 = false;
                      while ((lVar26 <= lVar13 &&
                             (0.0 < local_3c8.p
                                    [(lVar15 - local_3c8.begin.x) +
                                     ((long)local_528 - (long)local_3c8.begin.z) * local_3c8.kstride
                                     + iVar23 * local_3c8.jstride]))) {
                        bVar24 = (bool)(bVar24 | local_3c8.p
                                                 [(lVar15 - local_3c8.begin.x) +
                                                  ((long)local_528 - (long)local_3c8.begin.z) *
                                                  local_3c8.kstride + iVar23 * local_3c8.jstride] <
                                                 1.0);
                        lVar26 = lVar26 + 1;
                        iVar23 = iVar23 + -1;
                      }
                      uVar25 = (int)lVar26 + 1;
                      uVar5 = 2;
                      if (uVar25 < 2) {
                        uVar5 = uVar25;
                      }
                      if (!bVar24) {
                        uVar5 = uVar25;
                      }
                      if (uVar5 == 1) {
                        if (local_56c == Inhomogeneous) {
                          local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] =
                               local_540[lVar15 - local_538];
                        }
                        else {
                          local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] = 0.0;
                        }
                      }
                      else {
                        lVar26 = (long)(int)(uVar5 * 4 + -8);
                        iVar23 = local_41c - local_5b0.begin.y;
                        dVar28 = 0.0;
                        for (uVar22 = 1; uVar22 < uVar5; uVar22 = uVar22 + 1) {
                          dVar28 = dVar28 + local_5b0.p
                                            [(lVar15 - local_5b0.begin.x) +
                                             ((long)local_528 - (long)local_5b0.begin.z) *
                                             local_5b0.kstride +
                                             local_5b0.nstride * local_568 +
                                             local_5b0.jstride * iVar23] *
                                            *(double *)(low.vect + lVar26 * 2 + uVar22 * 2);
                          iVar23 = iVar23 + -1;
                        }
                        local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] = dVar28;
                        if (local_56c == Inhomogeneous) {
                          local_5b0.p[lVar16 + lVar21 + lVar10 + (lVar15 - lVar20)] =
                               local_540[lVar15 - local_538] * *(double *)(low.vect + lVar26 * 2) +
                               dVar28;
                        }
                      }
                    }
                  }
                  uVar22 = (ulong)(iVar7 + 1);
                }
              }
              else {
                lVar15 = local_418;
                if (local_4cc == 0x66) {
                  for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                    lVar19 = (lVar15 - local_4c0.begin.z) * local_4c0.kstride;
                    lVar10 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar16 = 0; local_4d8 + lVar16 <= local_548; lVar16 = lVar16 + 1) {
                      if ((*(int *)((long)local_4c0.p +
                                   lVar16 * 4 +
                                   (long)(iVar6 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                                   lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 0) &&
                         (*(int *)((long)local_4c0.p +
                                  lVar16 * 4 +
                                  local_4c0.jstride * 4 * (long)(local_41c - local_4c0.begin.y) +
                                  lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 1)) {
                        *(undefined8 *)
                         ((long)local_5b0.p +
                         lVar16 * 8 +
                         local_5b0.jstride * 8 * (long)(iVar6 - local_5b0.begin.y) + lVar10 * 8 +
                         local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 + local_460) =
                             *(undefined8 *)
                              ((long)local_5b0.p +
                              lVar16 * 8 +
                              (long)(local_41c - local_5b0.begin.y) * local_5b0.jstride * 8 +
                              lVar10 * 8 + local_5b0.nstride * local_550 +
                              (long)local_5b0.begin.x * -8 + local_460);
                      }
                    }
                  }
                }
                else if (local_4cc == 0x67) {
                  for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                    lVar19 = (lVar15 - local_4c0.begin.z) * local_4c0.kstride;
                    lVar10 = (lVar15 - local_5b0.begin.z) * local_5b0.kstride;
                    for (lVar16 = 0; local_4d8 + lVar16 <= local_548; lVar16 = lVar16 + 1) {
                      if ((*(int *)((long)local_4c0.p +
                                   lVar16 * 4 +
                                   (long)(iVar6 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                                   lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 0) &&
                         (*(int *)((long)local_4c0.p +
                                  lVar16 * 4 +
                                  local_4c0.jstride * 4 * (long)(local_41c - local_4c0.begin.y) +
                                  lVar19 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 1)) {
                        *(ulong *)((long)local_5b0.p +
                                  lVar16 * 8 +
                                  local_5b0.jstride * 8 * (long)(iVar6 - local_5b0.begin.y) +
                                  lVar10 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_460) =
                             *(ulong *)((long)local_5b0.p +
                                       lVar16 * 8 +
                                       (long)(local_41c - local_5b0.begin.y) * local_5b0.jstride * 8
                                       + lVar10 * 8 + local_5b0.nstride * local_550 +
                                       (long)local_5b0.begin.x * -8 + local_460) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
            else {
              dVar28 = 1.0;
              dVar29 = 1.0;
              if ((int)local_220 == 0) {
                if (iVar6 == 0x65) {
                  local_318[0] = -(double)local_528 * local_1f8;
                  local_318[1] = 0.5;
                  local_318[2] = 1.5;
                  local_318[3] = 2.5;
                  low.vect[0] = 0;
                  low.vect[1] = 0;
                  low.vect[2] = 0;
                  lVar16 = 2;
                  for (lVar19 = 0; lVar19 <= lVar10; lVar19 = lVar19 + 1) {
                    for (lVar21 = 0; lVar21 != lVar16; lVar21 = lVar21 + 1) {
                      dVar30 = dVar28;
                      dVar27 = dVar29;
                      for (lVar20 = 0; lVar16 != lVar20; lVar20 = lVar20 + 1) {
                        if (lVar21 != lVar20) {
                          dVar30 = dVar30 * (-0.5 - local_318[lVar20]);
                          dVar27 = dVar27 * (local_318[lVar21] - local_318[lVar20]);
                        }
                      }
                      *(double *)((long)&low + lVar21 * 8 + lVar19 * 0x20) = dVar30 / dVar27;
                    }
                    lVar16 = lVar16 + 1;
                  }
                  uVar22 = local_510 & 0xffffffff;
                  while (iVar6 = (int)uVar22, iVar6 <= local_55c) {
                    iVar7 = (int)local_428;
                    local_1c0 = iVar6;
                    local_528 = (double *)(long)iVar6;
                    lVar10 = ((long)local_528 - (long)local_4c0.begin.z) * local_4c0.kstride;
                    local_538 = (long)((int)lVar15 - local_4c0.begin.x);
                    local_540 = (double *)(long)local_5b0.begin.y;
                    local_500 = (double *)local_5b0.jstride;
                    local_558 = local_5b0.p +
                                ((long)iVar7 - (long)local_5b0.begin.x) +
                                ((long)local_528 - (long)local_5b0.begin.z) * local_5b0.kstride +
                                local_5b0.nstride * local_568;
                    local_430 = (double *)(long)local_268.begin.y;
                    local_218 = (double *)local_268.jstride;
                    local_1e8 = local_268.p +
                                ((long)iVar7 - (long)local_268.begin.x) +
                                ((long)local_528 - (long)local_268.begin.z) * local_268.kstride +
                                local_268.nstride * local_568;
                    for (lVar15 = local_470; lVar15 <= local_438; lVar15 = lVar15 + 1) {
                      lVar16 = (lVar15 - local_4c0.begin.y) * local_4c0.jstride;
                      if ((local_4c0.p[lVar16 + (iVar7 - local_4c0.begin.x) + lVar10] == 0) &&
                         (local_4c0.p[lVar16 + local_538 + lVar10] == 1)) {
                        lVar16 = 0;
                        bVar24 = false;
                        while ((lVar16 <= lVar13 &&
                               (0.0 < local_3c8.p
                                      [(lVar15 - local_3c8.begin.y) * local_3c8.jstride +
                                       ((long)local_528 - (long)local_3c8.begin.z) *
                                       local_3c8.kstride +
                                       (long)((local_20c - local_3c8.begin.x) + (int)lVar16)]))) {
                          bVar24 = (bool)(bVar24 | local_3c8.p
                                                   [(lVar15 - local_3c8.begin.y) * local_3c8.jstride
                                                    + ((long)local_528 - (long)local_3c8.begin.z) *
                                                      local_3c8.kstride +
                                                      (long)((local_20c - local_3c8.begin.x) +
                                                            (int)lVar16)] < 1.0);
                          lVar16 = lVar16 + 1;
                        }
                        uVar25 = (int)lVar16 + 1;
                        uVar5 = 2;
                        if (uVar25 < 2) {
                          uVar5 = uVar25;
                        }
                        if (!bVar24) {
                          uVar5 = uVar25;
                        }
                        if (uVar5 == 1) {
                          if (local_56c == Inhomogeneous) {
                            local_558[(lVar15 - (long)local_540) * local_5b0.jstride] =
                                 local_1e8[(lVar15 - (long)local_430) * local_268.jstride];
                          }
                          else {
                            local_558[(lVar15 - (long)local_540) * local_5b0.jstride] = 0.0;
                          }
                        }
                        else {
                          lVar16 = (long)(int)(uVar5 * 4 + -8);
                          dVar30 = 0.0;
                          for (uVar22 = 1; uVar22 < uVar5; uVar22 = uVar22 + 1) {
                            dVar30 = dVar30 + local_5b0.p
                                              [(lVar15 - local_5b0.begin.y) * local_5b0.jstride +
                                               ((long)local_528 - (long)local_5b0.begin.z) *
                                               local_5b0.kstride +
                                               local_5b0.nstride * local_568 +
                                               (long)((iVar7 - local_5b0.begin.x) + (int)uVar22)] *
                                              *(double *)(low.vect + lVar16 * 2 + uVar22 * 2);
                          }
                          lVar19 = (lVar15 - (long)local_540) * local_5b0.jstride;
                          local_558[lVar19] = dVar30;
                          if (local_56c == Inhomogeneous) {
                            local_558[lVar19] =
                                 local_1e8[(lVar15 - (long)local_430) * local_268.jstride] *
                                 *(double *)(low.vect + lVar16 * 2) + dVar30;
                          }
                        }
                      }
                    }
                    lVar15 = local_2b0;
                    uVar22 = (ulong)(iVar6 + 1);
                  }
                }
                else {
                  lVar15 = local_410;
                  if (iVar6 == 0x66) {
                    for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                      lVar16 = (local_470 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                               (lVar15 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                               (long)local_4c0.begin.x * -4 + (long)local_4c0.p;
                      lVar19 = local_5b0.nstride * local_550 +
                               (local_470 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                               (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                               (long)local_5b0.begin.x * -8 + (long)local_5b0.p;
                      for (lVar10 = local_470; lVar10 <= local_438; lVar10 = lVar10 + 1) {
                        if ((*(int *)(lVar16 + local_468 * 4) == 0) &&
                           (*(int *)(lVar16 + local_2b0 * 4) == 1)) {
                          *(undefined8 *)(lVar19 + local_468 * 8) =
                               *(undefined8 *)(lVar19 + local_2b0 * 8);
                        }
                        lVar16 = lVar16 + local_4c0.jstride * 4;
                        lVar19 = lVar19 + local_5b0.jstride * 8;
                      }
                    }
                  }
                  else if (iVar6 == 0x67) {
                    for (; (int)lVar15 <= local_55c; lVar15 = lVar15 + 1) {
                      lVar16 = (local_470 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                               (lVar15 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                               (long)local_4c0.begin.x * -4 + (long)local_4c0.p;
                      lVar19 = local_5b0.nstride * local_550 +
                               (local_470 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                               (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                               (long)local_5b0.begin.x * -8 + (long)local_5b0.p;
                      for (lVar10 = local_470; lVar10 <= local_438; lVar10 = lVar10 + 1) {
                        if ((*(int *)(lVar16 + local_468 * 4) == 0) &&
                           (*(int *)(lVar16 + local_2b0 * 4) == 1)) {
                          *(ulong *)(lVar19 + local_468 * 8) =
                               *(ulong *)(lVar19 + local_2b0 * 8) ^ 0x8000000000000000;
                        }
                        lVar16 = lVar16 + local_4c0.jstride * 4;
                        lVar19 = lVar19 + local_5b0.jstride * 8;
                      }
                    }
                  }
                }
                lVar15 = local_228;
                if (local_4cc == 0x65) {
                  local_318[0] = -local_188 * local_1f8;
                  local_318[1] = 0.5;
                  local_318[2] = 1.5;
                  local_318[3] = 2.5;
                  low.vect[0] = 0;
                  low.vect[1] = 0;
                  low.vect[2] = 0;
                  lVar10 = 2;
                  for (lVar16 = 0; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
                    for (lVar19 = 0; lVar19 != lVar10; lVar19 = lVar19 + 1) {
                      dVar30 = dVar28;
                      dVar27 = dVar29;
                      for (lVar21 = 0; lVar10 != lVar21; lVar21 = lVar21 + 1) {
                        if (lVar19 != lVar21) {
                          dVar30 = dVar30 * (-0.5 - local_318[lVar21]);
                          dVar27 = dVar27 * (local_318[lVar19] - local_318[lVar21]);
                        }
                      }
                      *(double *)((long)&low + lVar19 * 8 + lVar16 * 0x20) = dVar30 / dVar27;
                    }
                    lVar10 = lVar10 + 1;
                  }
                  uVar22 = local_4e0 & 0xffffffff;
                  while (iVar6 = (int)uVar22, iVar6 <= local_560) {
                    local_1e8 = (double *)CONCAT44(local_1e8._4_4_,iVar6);
                    local_528 = (double *)(long)iVar6;
                    lVar10 = ((long)local_528 - (long)local_4c0.begin.z) * local_4c0.kstride;
                    local_538 = (long)local_5b0.begin.y;
                    local_540 = (double *)local_5b0.jstride;
                    local_558 = local_5b0.p +
                                ((long)local_4e4 - (long)local_5b0.begin.x) +
                                ((long)local_528 - (long)local_5b0.begin.z) * local_5b0.kstride +
                                local_5b0.nstride * local_568;
                    local_500 = (double *)(long)local_2a8.begin.y;
                    local_430 = (double *)local_2a8.jstride;
                    local_218 = local_2a8.p +
                                ((long)local_4e4 - (long)local_2a8.begin.x) +
                                ((long)local_528 - (long)local_2a8.begin.z) * local_2a8.kstride +
                                local_2a8.nstride * local_568;
                    for (lVar15 = local_478; lVar15 <= local_440; lVar15 = lVar15 + 1) {
                      lVar16 = (lVar15 - local_4c0.begin.y) * local_4c0.jstride;
                      if ((local_4c0.p[lVar16 + (local_4e4 - local_4c0.begin.x) + lVar10] == 0) &&
                         (local_4c0.p[lVar16 + (~local_4c0.begin.x + local_4e4) + lVar10] == 1)) {
                        iVar7 = local_4e4 - local_3c8.begin.x;
                        lVar16 = 0;
                        bVar24 = false;
                        while ((lVar16 <= lVar13 &&
                               (0.0 < local_3c8.p
                                      [(lVar15 - local_3c8.begin.y) * local_3c8.jstride +
                                       ((long)local_528 - (long)local_3c8.begin.z) *
                                       local_3c8.kstride + (long)iVar7]))) {
                          bVar24 = (bool)(bVar24 | local_3c8.p
                                                   [(lVar15 - local_3c8.begin.y) * local_3c8.jstride
                                                    + ((long)local_528 - (long)local_3c8.begin.z) *
                                                      local_3c8.kstride + (long)iVar7] < 1.0);
                          lVar16 = lVar16 + 1;
                          iVar7 = iVar7 + -1;
                        }
                        uVar25 = (int)lVar16 + 1;
                        uVar5 = 2;
                        if (uVar25 < 2) {
                          uVar5 = uVar25;
                        }
                        if (!bVar24) {
                          uVar5 = uVar25;
                        }
                        if (uVar5 == 1) {
                          if (local_56c == Inhomogeneous) {
                            local_558[(lVar15 - local_538) * local_5b0.jstride] =
                                 local_218[(lVar15 - (long)local_500) * local_2a8.jstride];
                          }
                          else {
                            local_558[(lVar15 - local_538) * local_5b0.jstride] = 0.0;
                          }
                        }
                        else {
                          lVar16 = (long)(int)(uVar5 * 4 + -8);
                          iVar7 = (int)local_1d0 - local_5b0.begin.x;
                          dVar28 = 0.0;
                          for (uVar22 = 1; uVar22 < uVar5; uVar22 = uVar22 + 1) {
                            dVar28 = dVar28 + local_5b0.p
                                              [(lVar15 - local_5b0.begin.y) * local_5b0.jstride +
                                               ((long)local_528 - (long)local_5b0.begin.z) *
                                               local_5b0.kstride +
                                               local_5b0.nstride * local_568 + (long)iVar7] *
                                              *(double *)(low.vect + lVar16 * 2 + uVar22 * 2);
                            iVar7 = iVar7 + -1;
                          }
                          lVar19 = (lVar15 - local_538) * local_5b0.jstride;
                          local_558[lVar19] = dVar28;
                          if (local_56c == Inhomogeneous) {
                            local_558[lVar19] =
                                 local_218[(lVar15 - (long)local_500) * local_2a8.jstride] *
                                 *(double *)(low.vect + lVar16 * 2) + dVar28;
                          }
                        }
                      }
                    }
                    uVar22 = (ulong)(iVar6 + 1);
                  }
                }
                else {
                  lVar15 = local_418;
                  if (local_4cc == 0x66) {
                    for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                      lVar16 = (local_478 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                               (lVar15 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                               (long)local_4c0.begin.x * -4 + (long)local_4c0.p;
                      lVar19 = local_5b0.nstride * local_550 +
                               (local_478 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                               (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                               (long)local_5b0.begin.x * -8 + (long)local_5b0.p;
                      for (lVar10 = local_478; lVar10 <= local_440; lVar10 = lVar10 + 1) {
                        if ((*(int *)(lVar16 + local_4d8 * 4) == 0) &&
                           (*(int *)(lVar16 + local_1d0 * 4) == 1)) {
                          *(undefined8 *)(lVar19 + local_4d8 * 8) =
                               *(undefined8 *)(lVar19 + local_1d0 * 8);
                        }
                        lVar16 = lVar16 + local_4c0.jstride * 4;
                        lVar19 = lVar19 + local_5b0.jstride * 8;
                      }
                    }
                  }
                  else if (local_4cc == 0x67) {
                    for (; (int)lVar15 <= local_560; lVar15 = lVar15 + 1) {
                      lVar16 = (local_478 - local_4c0.begin.y) * local_4c0.jstride * 4 +
                               (lVar15 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                               (long)local_4c0.begin.x * -4 + (long)local_4c0.p;
                      lVar19 = local_5b0.nstride * local_550 +
                               (local_478 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                               (lVar15 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                               (long)local_5b0.begin.x * -8 + (long)local_5b0.p;
                      for (lVar10 = local_478; lVar10 <= local_440; lVar10 = lVar10 + 1) {
                        if ((*(int *)(lVar16 + local_4d8 * 4) == 0) &&
                           (*(int *)(lVar16 + local_1d0 * 4) == 1)) {
                          *(ulong *)(lVar19 + local_4d8 * 8) =
                               *(ulong *)(lVar19 + local_1d0 * 8) ^ 0x8000000000000000;
                        }
                        lVar16 = lVar16 + local_4c0.jstride * 4;
                        lVar19 = lVar19 + local_5b0.jstride * 8;
                      }
                    }
                  }
                }
              }
              else {
                iVar7 = (int)local_510;
                if (iVar6 == 0x65) {
                  local_318[0] = -(double)local_528 * local_208;
                  local_318[1] = 0.5;
                  local_318[2] = 1.5;
                  local_318[3] = 2.5;
                  low.vect[0] = 0;
                  low.vect[1] = 0;
                  low.vect[2] = 0;
                  lVar15 = 2;
                  for (lVar16 = 0; lVar16 <= lVar10; lVar16 = lVar16 + 1) {
                    for (lVar19 = 0; lVar19 != lVar15; lVar19 = lVar19 + 1) {
                      dVar30 = dVar28;
                      dVar27 = dVar29;
                      for (lVar21 = 0; lVar15 != lVar21; lVar21 = lVar21 + 1) {
                        if (lVar19 != lVar21) {
                          dVar30 = dVar30 * (-0.5 - local_318[lVar21]);
                          dVar27 = dVar27 * (local_318[lVar19] - local_318[lVar21]);
                        }
                      }
                      *(double *)((long)&low + lVar19 * 8 + lVar16 * 0x20) = dVar30 / dVar27;
                    }
                    lVar15 = lVar15 + 1;
                  }
                  uVar22 = local_4f0 & 0xffffffff;
                  while (iVar6 = (int)uVar22, iVar6 <= local_52c) {
                    local_430 = (double *)CONCAT44(local_430._4_4_,iVar6);
                    lVar16 = (long)iVar6;
                    lVar10 = (lVar16 - local_4c0.begin.y) * local_4c0.jstride;
                    local_538 = (local_4c8 - local_4c0.begin.z) * local_4c0.kstride;
                    local_558 = (double *)(long)local_5b0.begin.x;
                    local_528 = local_5b0.p +
                                (lVar16 - local_5b0.begin.y) * local_5b0.jstride +
                                ((long)iVar7 - (long)local_5b0.begin.z) * local_5b0.kstride +
                                local_5b0.nstride * local_568;
                    local_540 = (double *)(long)local_268.begin.x;
                    local_500 = local_268.p +
                                (lVar16 - local_268.begin.y) * local_268.jstride +
                                ((long)iVar7 - (long)local_268.begin.z) * local_268.kstride +
                                local_268.nstride * local_568;
                    for (lVar15 = local_468; lVar15 <= local_4f8; lVar15 = lVar15 + 1) {
                      if ((local_4c0.p
                           [lVar10 + (lVar15 - local_4c0.begin.x) +
                                     (iVar7 - local_4c0.begin.z) * local_4c0.kstride] == 0) &&
                         (local_4c0.p[lVar10 + (lVar15 - local_4c0.begin.x) + local_538] == 1)) {
                        lVar19 = 0;
                        bVar24 = false;
                        while ((lVar19 <= lVar13 &&
                               (0.0 < local_3c8.p
                                      [(lVar16 - local_3c8.begin.y) * local_3c8.jstride +
                                       (lVar15 - local_3c8.begin.x) +
                                       ((local_4c8 - local_3c8.begin.z) + (int)lVar19) *
                                       local_3c8.kstride]))) {
                          bVar24 = (bool)(bVar24 | local_3c8.p
                                                   [(lVar16 - local_3c8.begin.y) * local_3c8.jstride
                                                    + (lVar15 - local_3c8.begin.x) +
                                                      ((local_4c8 - local_3c8.begin.z) + (int)lVar19
                                                      ) * local_3c8.kstride] < 1.0);
                          lVar19 = lVar19 + 1;
                        }
                        uVar25 = (int)lVar19 + 1;
                        uVar5 = 2;
                        if (uVar25 < 2) {
                          uVar5 = uVar25;
                        }
                        if (!bVar24) {
                          uVar5 = uVar25;
                        }
                        if (uVar5 == 1) {
                          if (local_56c == Inhomogeneous) {
                            local_528[lVar15 - (long)local_558] =
                                 local_500[lVar15 - (long)local_540];
                          }
                          else {
                            local_528[lVar15 - (long)local_558] = 0.0;
                          }
                        }
                        else {
                          lVar19 = (long)(int)(uVar5 * 4 + -8);
                          dVar30 = 0.0;
                          for (uVar22 = 1; uVar22 < uVar5; uVar22 = uVar22 + 1) {
                            dVar30 = dVar30 + local_5b0.p
                                              [(lVar16 - local_5b0.begin.y) * local_5b0.jstride +
                                               (lVar15 - local_5b0.begin.x) +
                                               local_5b0.nstride * local_568 +
                                               ((iVar7 - local_5b0.begin.z) + (int)uVar22) *
                                               local_5b0.kstride] *
                                              *(double *)(low.vect + lVar19 * 2 + uVar22 * 2);
                          }
                          local_528[lVar15 - (long)local_558] = dVar30;
                          if (local_56c == Inhomogeneous) {
                            local_528[lVar15 - (long)local_558] =
                                 local_500[lVar15 - (long)local_540] *
                                 *(double *)(low.vect + lVar19 * 2) + dVar30;
                          }
                        }
                      }
                    }
                    uVar22 = (ulong)(iVar6 + 1);
                  }
                }
                else {
                  lVar15 = local_470;
                  if (iVar6 == 0x66) {
                    for (; (int)lVar15 <= local_52c; lVar15 = lVar15 + 1) {
                      lVar16 = (lVar15 - local_4c0.begin.y) * local_4c0.jstride;
                      lVar19 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                      for (lVar10 = 0; local_468 + lVar10 <= local_4f8; lVar10 = lVar10 + 1) {
                        if ((*(int *)((long)local_4c0.p +
                                     lVar10 * 4 +
                                     local_4c0.kstride * 4 * (long)(iVar7 - local_4c0.begin.z) +
                                     lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 0) &&
                           (*(int *)((long)local_4c0.p +
                                    lVar10 * 4 +
                                    (long)(local_4c8 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                                    lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 1)) {
                          *(undefined8 *)
                           ((long)local_5b0.p +
                           lVar10 * 8 +
                           (long)(iVar7 - local_5b0.begin.z) * local_5b0.kstride * 8 + lVar19 * 8 +
                           local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 + local_450)
                               = *(undefined8 *)
                                  ((long)local_5b0.p +
                                  lVar10 * 8 +
                                  local_5b0.kstride * 8 * (long)(local_4c8 - local_5b0.begin.z) +
                                  lVar19 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_450);
                        }
                      }
                    }
                  }
                  else if (iVar6 == 0x67) {
                    for (; (int)lVar15 <= local_52c; lVar15 = lVar15 + 1) {
                      lVar16 = (lVar15 - local_4c0.begin.y) * local_4c0.jstride;
                      lVar19 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                      for (lVar10 = 0; local_468 + lVar10 <= local_4f8; lVar10 = lVar10 + 1) {
                        if ((*(int *)((long)local_4c0.p +
                                     lVar10 * 4 +
                                     local_4c0.kstride * 4 * (long)(iVar7 - local_4c0.begin.z) +
                                     lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 0) &&
                           (*(int *)((long)local_4c0.p +
                                    lVar10 * 4 +
                                    (long)(local_4c8 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                                    lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_448) == 1)) {
                          *(ulong *)((long)local_5b0.p +
                                    lVar10 * 8 +
                                    (long)(iVar7 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                                    lVar19 * 8 + local_5b0.nstride * local_550 +
                                    (long)local_5b0.begin.x * -8 + local_450) =
                               *(ulong *)((long)local_5b0.p +
                                         lVar10 * 8 +
                                         local_5b0.kstride * 8 *
                                         (long)(local_4c8 - local_5b0.begin.z) + lVar19 * 8 +
                                         local_5b0.nstride * local_550 +
                                         (long)local_5b0.begin.x * -8 + local_450) ^
                               0x8000000000000000;
                        }
                      }
                    }
                  }
                }
                lVar15 = local_228;
                iVar6 = (int)local_4e0;
                if (local_4cc == 0x65) {
                  local_318[0] = -local_188 * local_208;
                  local_318[1] = 0.5;
                  local_318[2] = 1.5;
                  local_318[3] = 2.5;
                  low.vect[0] = 0;
                  low.vect[1] = 0;
                  low.vect[2] = 0;
                  lVar10 = 2;
                  for (lVar16 = 0; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
                    for (lVar19 = 0; lVar19 != lVar10; lVar19 = lVar19 + 1) {
                      dVar30 = dVar28;
                      dVar27 = dVar29;
                      for (lVar21 = 0; lVar10 != lVar21; lVar21 = lVar21 + 1) {
                        if (lVar19 != lVar21) {
                          dVar30 = dVar30 * (-0.5 - local_318[lVar21]);
                          dVar27 = dVar27 * (local_318[lVar19] - local_318[lVar21]);
                        }
                      }
                      *(double *)((long)&low + lVar19 * 8 + lVar16 * 0x20) = dVar30 / dVar27;
                    }
                    lVar10 = lVar10 + 1;
                  }
                  uVar22 = local_480 & 0xffffffff;
                  while (iVar7 = (int)uVar22, iVar7 <= local_504) {
                    local_430 = (double *)CONCAT44(local_430._4_4_,iVar7);
                    lVar16 = (long)iVar7;
                    lVar10 = (lVar16 - local_4c0.begin.y) * local_4c0.jstride;
                    local_538 = (~local_4c0.begin.z + iVar6) * local_4c0.kstride;
                    local_558 = (double *)(long)local_5b0.begin.x;
                    local_528 = local_5b0.p +
                                (lVar16 - local_5b0.begin.y) * local_5b0.jstride +
                                ((long)iVar6 - (long)local_5b0.begin.z) * local_5b0.kstride +
                                local_5b0.nstride * local_568;
                    local_540 = (double *)(long)local_2a8.begin.x;
                    local_500 = local_2a8.p +
                                (lVar16 - local_2a8.begin.y) * local_2a8.jstride +
                                ((long)iVar6 - (long)local_2a8.begin.z) * local_2a8.kstride +
                                local_2a8.nstride * local_568;
                    for (lVar15 = local_4d8; lVar15 <= local_548; lVar15 = lVar15 + 1) {
                      if ((local_4c0.p
                           [lVar10 + (lVar15 - local_4c0.begin.x) +
                                     (iVar6 - local_4c0.begin.z) * local_4c0.kstride] == 0) &&
                         (local_4c0.p[lVar10 + (lVar15 - local_4c0.begin.x) + local_538] == 1)) {
                        iVar23 = iVar6 - local_3c8.begin.z;
                        lVar19 = 0;
                        bVar24 = false;
                        while ((lVar19 <= lVar13 &&
                               (0.0 < local_3c8.p
                                      [(lVar16 - local_3c8.begin.y) * local_3c8.jstride +
                                       (lVar15 - local_3c8.begin.x) + iVar23 * local_3c8.kstride])))
                        {
                          bVar24 = (bool)(bVar24 | local_3c8.p
                                                   [(lVar16 - local_3c8.begin.y) * local_3c8.jstride
                                                    + (lVar15 - local_3c8.begin.x) +
                                                      iVar23 * local_3c8.kstride] < 1.0);
                          lVar19 = lVar19 + 1;
                          iVar23 = iVar23 + -1;
                        }
                        uVar25 = (int)lVar19 + 1;
                        uVar5 = 2;
                        if (uVar25 < 2) {
                          uVar5 = uVar25;
                        }
                        if (!bVar24) {
                          uVar5 = uVar25;
                        }
                        if (uVar5 == 1) {
                          if (local_56c == Inhomogeneous) {
                            local_528[lVar15 - (long)local_558] =
                                 local_500[lVar15 - (long)local_540];
                          }
                          else {
                            local_528[lVar15 - (long)local_558] = 0.0;
                          }
                        }
                        else {
                          lVar19 = (long)(int)(uVar5 * 4 + -8);
                          iVar23 = local_420 - local_5b0.begin.z;
                          dVar28 = 0.0;
                          for (uVar22 = 1; uVar22 < uVar5; uVar22 = uVar22 + 1) {
                            dVar28 = dVar28 + local_5b0.p
                                              [(lVar16 - local_5b0.begin.y) * local_5b0.jstride +
                                               (lVar15 - local_5b0.begin.x) +
                                               local_5b0.nstride * local_568 +
                                               local_5b0.kstride * iVar23] *
                                              *(double *)(low.vect + lVar19 * 2 + uVar22 * 2);
                            iVar23 = iVar23 + -1;
                          }
                          local_528[lVar15 - (long)local_558] = dVar28;
                          if (local_56c == Inhomogeneous) {
                            local_528[lVar15 - (long)local_558] =
                                 local_500[lVar15 - (long)local_540] *
                                 *(double *)(low.vect + lVar19 * 2) + dVar28;
                          }
                        }
                      }
                    }
                    uVar22 = (ulong)(iVar7 + 1);
                  }
                }
                else {
                  lVar15 = local_478;
                  if (local_4cc == 0x66) {
                    for (; (int)lVar15 <= local_504; lVar15 = lVar15 + 1) {
                      lVar16 = (lVar15 - local_4c0.begin.y) * local_4c0.jstride;
                      lVar19 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                      for (lVar10 = 0; local_4d8 + lVar10 <= local_548; lVar10 = lVar10 + 1) {
                        if ((*(int *)((long)local_4c0.p +
                                     lVar10 * 4 +
                                     local_4c0.kstride * 4 * (long)(iVar6 - local_4c0.begin.z) +
                                     lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 0) &&
                           (*(int *)((long)local_4c0.p +
                                    lVar10 * 4 +
                                    (long)(local_420 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                                    lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 1)) {
                          *(undefined8 *)
                           ((long)local_5b0.p +
                           lVar10 * 8 +
                           (long)(iVar6 - local_5b0.begin.z) * local_5b0.kstride * 8 + lVar19 * 8 +
                           local_5b0.nstride * local_550 + (long)local_5b0.begin.x * -8 + local_460)
                               = *(undefined8 *)
                                  ((long)local_5b0.p +
                                  lVar10 * 8 +
                                  local_5b0.kstride * 8 * (long)(local_420 - local_5b0.begin.z) +
                                  lVar19 * 8 + local_5b0.nstride * local_550 +
                                  (long)local_5b0.begin.x * -8 + local_460);
                        }
                      }
                    }
                  }
                  else if (local_4cc == 0x67) {
                    for (; (int)lVar15 <= local_504; lVar15 = lVar15 + 1) {
                      lVar16 = (lVar15 - local_4c0.begin.y) * local_4c0.jstride;
                      lVar19 = (lVar15 - local_5b0.begin.y) * local_5b0.jstride;
                      for (lVar10 = 0; local_4d8 + lVar10 <= local_548; lVar10 = lVar10 + 1) {
                        if ((*(int *)((long)local_4c0.p +
                                     lVar10 * 4 +
                                     local_4c0.kstride * 4 * (long)(iVar6 - local_4c0.begin.z) +
                                     lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 0) &&
                           (*(int *)((long)local_4c0.p +
                                    lVar10 * 4 +
                                    (long)(local_420 - local_4c0.begin.z) * local_4c0.kstride * 4 +
                                    lVar16 * 4 + (long)local_4c0.begin.x * -4 + local_458) == 1)) {
                          *(ulong *)((long)local_5b0.p +
                                    lVar10 * 8 +
                                    (long)(iVar6 - local_5b0.begin.z) * local_5b0.kstride * 8 +
                                    lVar19 * 8 + local_5b0.nstride * local_550 +
                                    (long)local_5b0.begin.x * -8 + local_460) =
                               *(ulong *)((long)local_5b0.p +
                                         lVar10 * 8 +
                                         local_5b0.kstride * 8 *
                                         (long)(local_420 - local_5b0.begin.z) + lVar19 * 8 +
                                         local_5b0.nstride * local_550 +
                                         (long)local_5b0.begin.x * -8 + local_460) ^
                               0x8000000000000000;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar22 = local_568 + 1;
          local_550 = local_550 + 8;
        }
        lVar13 = local_220 + 1;
      }
    }
    else {
      piVar17 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar17 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      local_31c = EBCellFlagFab::getType
                            ((local_1d8->m_fabs_v).
                             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[*piVar17],&local_1a4);
      if (local_31c != covered) goto LAB_0066843c;
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLEBABecLap::applyBC (int amrlev, int mglev, MultiFab& in, BCMode bc_mode, StateMode s_mode,
                      const MLMGBndry* bndry, bool skip_fillboundary) const
{
    BL_PROFILE("MLEBABecLap::applyBC()");

    // No coarsened boundary values, cannot apply inhomog at mglev>0.
    BL_ASSERT(mglev == 0 || bc_mode == BCMode::Homogeneous);
    BL_ASSERT(bndry != nullptr || bc_mode == BCMode::Homogeneous);

    const int ncomp = getNComp();
    if (!skip_fillboundary) {
        const int cross = false;
        in.FillBoundary(0, ncomp, m_geom[amrlev][mglev].periodicity(),cross);
    }

    int m_is_inhomog = bc_mode == BCMode::Inhomogeneous;
    int flagbc = m_is_inhomog;
    m_is_eb_inhomog = s_mode == StateMode::Solution;
    const int imaxorder = maxorder;
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(imaxorder <= 4, "MLEBABecLap::applyBC: maxorder too high");

    const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
    const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : 1.0;
    const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : 1.0;

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];

    const auto& ccmask = m_cc_mask[amrlev][mglev];

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};

    FArrayBox foofab(Box::TheUnitBox(),ncomp);
    const auto& foo = foofab.array();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& vbx   = mfi.validbox();
        const auto& iofab = in.array(mfi);

        auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;
        if (fabtyp != FabType::covered)
        {
            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                const Orientation olo(idim,Orientation::low);
                const Orientation ohi(idim,Orientation::high);
                Box blo = amrex::adjCellLo(vbx, idim);
                Box bhi = amrex::adjCellHi(vbx, idim);
                if (fabtyp != FabType::regular) {
                    blo.grow(IntVect(1)-IntVect::TheDimensionVector(idim));
                    bhi.grow(IntVect(1)-IntVect::TheDimensionVector(idim));
                }
                const int blen = vbx.length(idim);
                const auto& mlo = maskvals[olo].array(mfi);
                const auto& mhi = maskvals[ohi].array(mfi);
                const auto& bvlo = (bndry != nullptr) ? bndry->bndryValues(olo).array(mfi) : foo;
                const auto& bvhi = (bndry != nullptr) ? bndry->bndryValues(ohi).array(mfi) : foo;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    const BoundCond bctlo = bdcv[icomp][olo];
                    const BoundCond bcthi = bdcv[icomp][ohi];
                    const Real bcllo = bdlv[icomp][olo];
                    const Real bclhi = bdlv[icomp][ohi];
                    if (fabtyp == FabType::regular)
                    {
                        if (idim == 0) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_x(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dxi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_x(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dxi, flagbc, icomp);
                            });
                        } else if (idim == 1) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_y(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dyi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_y(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dyi, flagbc, icomp);
                            });
                        } else {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_z(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dzi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_z(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dzi, flagbc, icomp);
                            });
                        }
                    }
                    else // irregular
                    {
                        const auto& ap = area[idim]->const_array(mfi);
                        const auto& mask = ccmask.const_array(mfi);
                        if (idim == 0) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_x(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dxi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_x(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dxi, flagbc, icomp);
                            });
                        } else if (idim == 1) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_y(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dyi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_y(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dyi, flagbc, icomp);
                            });
                        } else {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_z(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dzi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_z(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dzi, flagbc, icomp);
                            });
                        }
                    }
                }
            }
        }
    }
}